

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

void createSimpleFeatureVectorizerModel
               (Model *spec,char *outputName,ArrayFeatureType_ArrayDataType arrayType,int inputSize)

{
  _func_int **pp_Var1;
  Metadata *this;
  Arena *pAVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *pAVar4;
  RepeatedField<long> *this_00;
  bool *pbVar5;
  FeatureVectorizer_InputColumn *this_01;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  FeatureVectorizer_InputColumn *local_128;
  FeatureVectorizer_InputColumn *inputlist;
  FeatureVectorizer *pFStack_118;
  int d_1;
  FeatureVectorizer *featurVectorizerModel;
  FeatureType *local_108;
  FeatureType *outputType;
  FeatureDescription *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  FeatureType *local_b8;
  FeatureType *inputType;
  FeatureDescription *input;
  int d;
  allocator<char> local_91;
  string local_90 [32];
  Metadata *local_70;
  Metadata *metadata;
  ModelDescription *interface;
  int inputSize_local;
  ArrayFeatureType_ArrayDataType arrayType_local;
  char *outputName_local;
  Model *spec_local;
  FeatureType *local_40;
  TypeUnion local_38;
  Metadata *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  FeatureType *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  FeatureVectorizer_InputColumn *local_10;
  
  interface._0_4_ = inputSize;
  interface._4_4_ = arrayType;
  _inputSize_local = (_func_int **)outputName;
  outputName_local = (char *)spec;
  CoreML::Specification::Model::set_specificationversion(spec,9);
  metadata = (Metadata *)
             CoreML::Specification::Model::mutable_description((Model *)outputName_local);
  this = CoreML::Specification::ModelDescription::mutable_metadata((ModelDescription *)metadata);
  local_70 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"Testing serialization",&local_91);
  local_38.pipelineclassifier_ = (PipelineClassifier *)local_90;
  local_30 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set
            (&this->shortdescription_,(PipelineClassifier *)local_90,pAVar2);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  for (input._0_4_ = 0; (int)input < (int)interface; input._0_4_ = (int)input + 1) {
    inputType = (FeatureType *)
                CoreML::Specification::ModelDescription::add_input((ModelDescription *)metadata);
    pFVar3 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar3);
    local_b8 = pFVar3;
    CoreML::Specification::FeatureType::mutable_doubletype(pFVar3);
    pFVar3 = inputType;
    std::__cxx11::to_string((string *)&output,(int)input);
    std::operator+(&local_d8,"input",(string *)&output);
    local_20 = pFVar3;
    local_28 = &local_d8;
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&pFVar3->isoptional_,&local_d8,pAVar2);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&output);
    CoreML::Specification::FeatureDescription::set_allocated_type
              ((FeatureDescription *)inputType,local_b8);
  }
  outputType = (FeatureType *)
               CoreML::Specification::ModelDescription::add_output((ModelDescription *)metadata);
  pFVar3 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar3);
  local_108 = pFVar3;
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  this_00 = CoreML::Specification::ArrayFeatureType::mutable_shape(pAVar4);
  featurVectorizerModel = (FeatureVectorizer *)(long)(int)interface;
  google::protobuf::RepeatedField<long>::Add(this_00,(long *)&featurVectorizerModel);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(local_108);
  CoreML::Specification::ArrayFeatureType::set_datatype(pAVar4,interface._4_4_);
  pp_Var1 = _inputSize_local;
  local_40 = outputType;
  spec_local = (Model *)&inputSize_local;
  pbVar5 = &outputType->isoptional_;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&outputType->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)pbVar5,pp_Var1,pAVar2);
  CoreML::Specification::FeatureDescription::set_allocated_type
            ((FeatureDescription *)outputType,local_108);
  pFStack_118 = CoreML::Specification::Model::mutable_featurevectorizer((Model *)outputName_local);
  for (inputlist._4_4_ = 0; inputlist._4_4_ < (int)interface; inputlist._4_4_ = inputlist._4_4_ + 1)
  {
    this_01 = CoreML::Specification::FeatureVectorizer::add_inputlist(pFStack_118);
    local_128 = this_01;
    std::__cxx11::to_string(&local_168,inputlist._4_4_);
    std::operator+(&local_148,"input",&local_168);
    local_18 = &local_148;
    local_10 = this_01;
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this_01->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this_01->inputcolumn_,&local_148,pAVar2);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    CoreML::Specification::FeatureVectorizer_InputColumn::set_inputdimensions(local_128,1);
  }
  return;
}

Assistant:

void createSimpleFeatureVectorizerModel(Specification::Model *spec, const char *outputName, Specification::ArrayFeatureType_ArrayDataType arrayType, int inputSize) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
    
    auto interface = spec->mutable_description();
    auto metadata = interface->mutable_metadata();
    metadata->set_shortdescription(std::string("Testing serialization"));
    
    for (int d = 0; d < inputSize; d++) {
        auto input = interface->add_input();
        auto inputType = new Specification::FeatureType;
        inputType->mutable_doubletype();
        input->set_name("input" + std::to_string(d));
        input->set_allocated_type(inputType);
    }
    
    auto output = interface->add_output();
    auto outputType = new Specification::FeatureType;
    outputType->mutable_multiarraytype()->mutable_shape()->Add(inputSize);
    outputType->mutable_multiarraytype()->set_datatype(arrayType);
    output->set_name(outputName);
    output->set_allocated_type(outputType);
    
    auto featurVectorizerModel = spec->mutable_featurevectorizer();
    
    for (int d = 0; d < inputSize; d++) {
        auto inputlist = featurVectorizerModel->add_inputlist();
        inputlist->set_inputcolumn("input" + std::to_string(d));
        inputlist->set_inputdimensions(1);
    }
    
}